

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * __thiscall
FSerializer::Args(FSerializer *this,char *key,int *args,int *defargs,int special)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  int iVar4;
  SizeType SVar5;
  undefined8 in_RAX;
  Value *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  Ch *cc;
  char *text;
  ulong uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  pFVar3 = this->w;
  if (pFVar3 == (FWriter *)0x0) {
    uStack_38 = in_RAX;
    this_00 = FReader::FindKey(this->r,key);
    if (this_00 != (Value *)0x0) {
      if ((this_00->data_).f.flags != 4) {
        __assert_fail("false && \"array expected\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x2f5,"FSerializer &FSerializer::Args(const char *, int *, int *, int)");
      }
      SVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(this_00);
      uVar6 = 5;
      if (SVar5 < 5) {
        uVar6 = (ulong)SVar5;
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this_00,(SizeType)uVar8);
        uVar1 = (this_01->data_).f.flags;
        if ((uVar1 & 0x20) == 0) {
          if ((uVar8 != 0) || ((uVar1 & 0x400) == 0)) {
            __assert_fail("false && \"Integer expected\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                          ,0x2ed,"FSerializer &FSerializer::Args(const char *, int *, int *, int)");
          }
          cc = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_01);
          text = UnicodeToString(cc);
          FName::FName((FName *)((long)&uStack_38 + 4),text);
          *args = -uStack_38._4_4_;
        }
        else {
          iVar4 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt(this_01);
          args[uVar8] = iVar4;
        }
      }
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 == 0) || (defargs == (int *)0x0)) ||
        ((pFVar3->mInObject).Array[uVar2 - 1] == false)) ||
       (iVar4 = bcmp(args,defargs,0x14), iVar4 != 0)) {
      WriteKey(this,key);
      FWriter::StartArray(this->w);
      lVar7 = 0;
      do {
        if (lVar7 == 0) {
          if ((-1 < *args) || ((5 < special - 0x50U && (special != 0xe2)))) goto LAB_00472262;
          FWriter::String(this->w,FName::NameData.NameArray[(uint)-*args].Text);
        }
        else {
          if (lVar7 == 5) {
            FWriter::EndArray(this->w);
            return this;
          }
LAB_00472262:
          FWriter::Int(this->w,args[lVar7]);
        }
        lVar7 = lVar7 + 1;
      } while( true );
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Args(const char *key, int *args, int *defargs, int special)
{
	if (isWriting())
	{
		if (w->inObject() && defargs != nullptr && !memcmp(args, defargs, 5 * sizeof(int)))
		{
			return *this;
		}

		WriteKey(key);
		w->StartArray();
		for (int i = 0; i < 5; i++)
		{
			if (i == 0 && args[i] < 0 && P_IsACSSpecial(special))
			{
				w->String(FName(ENamedName(-args[i])).GetChars());
			}
			else
			{
				w->Int(args[i]);
			}
		}
		w->EndArray();
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				unsigned int cnt = MIN<unsigned>(val->Size(), 5);
				for (unsigned int i = 0; i < cnt; i++)
				{
					const rapidjson::Value &aval = (*val)[i];
					if (aval.IsInt())
					{
						args[i] = aval.GetInt();
					}
					else if (i == 0 && aval.IsString())
					{
						args[i] = -FName(UnicodeToString(aval.GetString()));
					}
					else
					{
						assert(false && "Integer expected");
						Printf(TEXTCOLOR_RED "Integer expected for '%s[%d]'", key, i);
						mErrors++;
					}
				}
			}
			else
			{
				assert(false && "array expected");
				Printf(TEXTCOLOR_RED "array expected for '%s'", key);
				mErrors++;
			}
		}
	}
	return *this;
}